

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QRect>::begin(QList<QRect> *this)

{
  QRect *n;
  QArrayDataPointer<QRect> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QRect> *)0x617d69);
  QArrayDataPointer<QRect>::operator->(in_RDI);
  n = QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x617d7a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }